

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoding.c
# Opt level: O1

exr_result_t default_decompress_chunk(exr_decode_pipeline_t *decode)

{
  _internal_exr_context *pctxt;
  _internal_exr_part *p_Var1;
  exr_result_t eVar2;
  exr_result_t eVar3;
  long lVar4;
  size_t unpacksz;
  bool bVar5;
  
  pctxt = (_internal_exr_context *)decode->context;
  if (pctxt == (_internal_exr_context *)0x0) {
    eVar2 = 2;
  }
  else {
    if (pctxt->mode != '\0') {
      eVar2 = (*pctxt->standard_error)(pctxt,7);
      return eVar2;
    }
    lVar4 = (long)decode->part_index;
    if ((lVar4 < 0) || (pctxt->num_parts <= decode->part_index)) {
      eVar2 = (*pctxt->print_error)(pctxt,4,"Part index (%d) out of range",lVar4,pctxt->print_error)
      ;
      return eVar2;
    }
    p_Var1 = pctxt->parts[lVar4];
    eVar2 = 0;
    if ((p_Var1->storage_mode & ~EXR_STORAGE_TILED) == EXR_STORAGE_DEEP_SCANLINE) {
      unpacksz = (long)(decode->chunk).height * (long)(decode->chunk).width * 4;
      eVar2 = decompress_data(pctxt,p_Var1->comp_type,decode,decode->packed_sample_count_table,
                              (decode->chunk).sample_count_table_size,decode->sample_count_table,
                              unpacksz);
      if (eVar2 == 0) {
        bVar5 = (decode->decode_flags & 4) == 0;
        eVar3 = 0;
      }
      else {
        bVar5 = false;
        eVar3 = (*pctxt->print_error)
                          (pctxt,eVar2,"Unable to decompress sample table %lu -> %lu",
                           (decode->chunk).sample_count_table_size,unpacksz);
      }
      if (!bVar5) {
        return eVar3;
      }
    }
    if (eVar2 == 0) {
      eVar2 = decompress_data(pctxt,p_Var1->comp_type,decode,decode->packed_buffer,
                              (decode->chunk).packed_size,decode->unpacked_buffer,
                              (decode->chunk).unpacked_size);
    }
    if (eVar2 != 0) {
      eVar2 = (*pctxt->print_error)
                        (pctxt,eVar2,"Unable to decompress image data %lu -> %lu",
                         (decode->chunk).packed_size,(decode->chunk).unpacked_size,
                         pctxt->print_error);
      return eVar2;
    }
    eVar2 = 0;
  }
  return eVar2;
}

Assistant:

static exr_result_t
default_decompress_chunk (exr_decode_pipeline_t* decode)
{
    exr_result_t rv = EXR_ERR_SUCCESS;
    EXR_PROMOTE_READ_CONST_CONTEXT_AND_PART_OR_ERROR (
        decode->context, decode->part_index);

    if (part->storage_mode == EXR_STORAGE_DEEP_SCANLINE ||
        part->storage_mode == EXR_STORAGE_DEEP_TILED)
    {
        uint64_t sampsize =
            (((uint64_t) decode->chunk.width) *
             ((uint64_t) decode->chunk.height));
        sampsize *= sizeof (int32_t);

        rv = decompress_data (
            pctxt,
            part->comp_type,
            decode,
            decode->packed_sample_count_table,
            decode->chunk.sample_count_table_size,
            decode->sample_count_table,
            sampsize);

        if (rv != EXR_ERR_SUCCESS)
        {
            return pctxt->print_error (
                pctxt,
                rv,
                "Unable to decompress sample table %" PRIu64 " -> %" PRIu64,
                decode->chunk.sample_count_table_size,
                (uint64_t) sampsize);
        }
        if ((decode->decode_flags & EXR_DECODE_SAMPLE_DATA_ONLY)) return rv;
    }

    if (rv == EXR_ERR_SUCCESS)
        rv = decompress_data (
            pctxt,
            part->comp_type,
            decode,
            decode->packed_buffer,
            decode->chunk.packed_size,
            decode->unpacked_buffer,
            decode->chunk.unpacked_size);

    if (rv != EXR_ERR_SUCCESS)
    {
        return pctxt->print_error (
            pctxt,
            rv,
            "Unable to decompress image data %" PRIu64 " -> %" PRIu64,
            decode->chunk.packed_size,
            decode->chunk.unpacked_size);
    }
    return rv;
}